

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O2

Quat4f __thiscall Quat4f::fromRotationMatrix(Quat4f *this,Matrix3f *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float *pfVar5;
  float fVar6;
  float fVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  Quat4f QVar21;
  
  pfVar5 = Matrix3f::operator()(m,0,0);
  fVar1 = *pfVar5;
  pfVar5 = Matrix3f::operator()(m,1,1);
  fVar2 = *pfVar5;
  pfVar5 = Matrix3f::operator()(m,2,2);
  auVar9._0_8_ = (double)(fVar1 + 1.0 + fVar2 + *pfVar5);
  auVar9._8_8_ = 0;
  if (auVar9._0_8_ <= 1e-05) {
    pfVar5 = Matrix3f::operator()(m,0,0);
    fVar1 = *pfVar5;
    pfVar5 = Matrix3f::operator()(m,1,1);
    fVar2 = *pfVar5;
    pfVar5 = Matrix3f::operator()(m,0,0);
    fVar3 = *pfVar5;
    pfVar5 = Matrix3f::operator()(m,2,2);
    if ((fVar1 <= fVar2) || (fVar3 <= *pfVar5)) {
      pfVar5 = Matrix3f::operator()(m,1,1);
      fVar1 = *pfVar5;
      pfVar5 = Matrix3f::operator()(m,2,2);
      if (fVar1 <= *pfVar5) {
        pfVar5 = Matrix3f::operator()(m,2,2);
        fVar1 = *pfVar5;
        pfVar5 = Matrix3f::operator()(m,0,0);
        fVar2 = *pfVar5;
        pfVar5 = Matrix3f::operator()(m,1,1);
        auVar12._0_8_ = (double)(((fVar1 + 1.0) - fVar2) - *pfVar5);
        auVar12._8_8_ = 0;
        if (auVar12._0_8_ < 0.0) {
          dVar8 = sqrt(auVar12._0_8_);
        }
        else {
          auVar9 = vsqrtsd_avx(auVar12,auVar12);
          dVar8 = auVar9._0_8_;
        }
        fVar7 = (float)(dVar8 + dVar8);
        pfVar5 = Matrix3f::operator()(m,0,2);
        fVar1 = *pfVar5;
        pfVar5 = Matrix3f::operator()(m,2,0);
        fVar2 = *pfVar5;
        pfVar5 = Matrix3f::operator()(m,1,2);
        fVar3 = *pfVar5;
        pfVar5 = Matrix3f::operator()(m,2,1);
        fVar4 = *pfVar5;
        pfVar5 = Matrix3f::operator()(m,0,1);
        fVar6 = *pfVar5;
        pfVar5 = Matrix3f::operator()(m,1,0);
        auVar19._4_4_ = fVar7;
        auVar19._0_4_ = fVar7;
        auVar19._8_4_ = fVar7;
        auVar19._12_4_ = fVar7;
        auVar9 = vinsertps_avx(ZEXT416((uint)(fVar6 - *pfVar5)),ZEXT416((uint)(fVar1 + fVar2)),0x10)
        ;
        auVar9 = vinsertps_avx(auVar9,ZEXT416((uint)(fVar3 + fVar4)),0x20);
        auVar9 = vdivps_avx(auVar9,auVar19);
        fVar7 = fVar7 * 0.25;
        auVar20._4_4_ = fVar7;
        auVar20._0_4_ = fVar7;
        auVar20._8_4_ = fVar7;
        auVar20._12_4_ = fVar7;
        vblendps_avx(auVar9,auVar20,8);
      }
      else {
        pfVar5 = Matrix3f::operator()(m,1,1);
        fVar1 = *pfVar5;
        pfVar5 = Matrix3f::operator()(m,0,0);
        fVar2 = *pfVar5;
        pfVar5 = Matrix3f::operator()(m,2,2);
        auVar11._0_8_ = (double)(((fVar1 + 1.0) - fVar2) - *pfVar5);
        auVar11._8_8_ = 0;
        if (auVar11._0_8_ < 0.0) {
          dVar8 = sqrt(auVar11._0_8_);
        }
        else {
          auVar9 = vsqrtsd_avx(auVar11,auVar11);
          dVar8 = auVar9._0_8_;
        }
        fVar7 = (float)(dVar8 + dVar8);
        pfVar5 = Matrix3f::operator()(m,0,1);
        fVar1 = *pfVar5;
        pfVar5 = Matrix3f::operator()(m,1,0);
        fVar2 = *pfVar5;
        pfVar5 = Matrix3f::operator()(m,1,2);
        fVar3 = *pfVar5;
        pfVar5 = Matrix3f::operator()(m,2,1);
        fVar4 = *pfVar5;
        pfVar5 = Matrix3f::operator()(m,0,2);
        fVar6 = *pfVar5;
        pfVar5 = Matrix3f::operator()(m,2,0);
        auVar17._4_4_ = fVar7;
        auVar17._0_4_ = fVar7;
        auVar17._8_4_ = fVar7;
        auVar17._12_4_ = fVar7;
        auVar9 = vinsertps_avx(ZEXT416((uint)(fVar6 - *pfVar5)),ZEXT416((uint)(fVar1 + fVar2)),0x10)
        ;
        auVar9 = vinsertps_avx(auVar9,ZEXT416((uint)(fVar3 + fVar4)),0x30);
        auVar9 = vdivps_avx(auVar9,auVar17);
        fVar7 = fVar7 * 0.25;
        auVar18._4_4_ = fVar7;
        auVar18._0_4_ = fVar7;
        auVar18._8_4_ = fVar7;
        auVar18._12_4_ = fVar7;
        vblendps_avx(auVar9,auVar18,4);
      }
    }
    else {
      pfVar5 = Matrix3f::operator()(m,0,0);
      fVar1 = *pfVar5;
      pfVar5 = Matrix3f::operator()(m,1,1);
      fVar2 = *pfVar5;
      pfVar5 = Matrix3f::operator()(m,2,2);
      auVar10._0_8_ = (double)(((fVar1 + 1.0) - fVar2) - *pfVar5);
      auVar10._8_8_ = 0;
      if (auVar10._0_8_ < 0.0) {
        dVar8 = sqrt(auVar10._0_8_);
      }
      else {
        auVar9 = vsqrtsd_avx(auVar10,auVar10);
        dVar8 = auVar9._0_8_;
      }
      fVar7 = (float)(dVar8 + dVar8);
      pfVar5 = Matrix3f::operator()(m,0,1);
      fVar1 = *pfVar5;
      pfVar5 = Matrix3f::operator()(m,1,0);
      fVar2 = *pfVar5;
      pfVar5 = Matrix3f::operator()(m,0,2);
      fVar3 = *pfVar5;
      pfVar5 = Matrix3f::operator()(m,2,0);
      fVar4 = *pfVar5;
      pfVar5 = Matrix3f::operator()(m,1,2);
      fVar6 = *pfVar5;
      pfVar5 = Matrix3f::operator()(m,2,1);
      auVar15._4_4_ = fVar7;
      auVar15._0_4_ = fVar7;
      auVar15._8_4_ = fVar7;
      auVar15._12_4_ = fVar7;
      auVar9 = vinsertps_avx(ZEXT416((uint)(fVar6 - *pfVar5)),ZEXT416((uint)(fVar1 + fVar2)),0x20);
      auVar9 = vinsertps_avx(auVar9,ZEXT416((uint)(fVar3 + fVar4)),0x30);
      auVar9 = vdivps_avx(auVar9,auVar15);
      fVar7 = fVar7 * 0.25;
      auVar16._4_4_ = fVar7;
      auVar16._0_4_ = fVar7;
      auVar16._8_4_ = fVar7;
      auVar16._12_4_ = fVar7;
      vblendps_avx(auVar9,auVar16,2);
    }
  }
  else {
    if (auVar9._0_8_ < 0.0) {
      dVar8 = sqrt(auVar9._0_8_);
    }
    else {
      auVar9 = vsqrtsd_avx(auVar9,auVar9);
      dVar8 = auVar9._0_8_;
    }
    fVar6 = (float)(dVar8 + dVar8);
    pfVar5 = Matrix3f::operator()(m,2,1);
    fVar1 = *pfVar5;
    pfVar5 = Matrix3f::operator()(m,1,2);
    fVar1 = fVar1 - *pfVar5;
    pfVar5 = Matrix3f::operator()(m,0,2);
    fVar2 = *pfVar5;
    pfVar5 = Matrix3f::operator()(m,2,0);
    fVar3 = *pfVar5;
    pfVar5 = Matrix3f::operator()(m,1,0);
    fVar4 = *pfVar5;
    pfVar5 = Matrix3f::operator()(m,0,1);
    auVar13._4_4_ = fVar1;
    auVar13._0_4_ = fVar1;
    auVar13._8_4_ = fVar1;
    auVar13._12_4_ = fVar1;
    auVar9 = vinsertps_avx(auVar13,ZEXT416((uint)(fVar2 - fVar3)),0x20);
    auVar9 = vinsertps_avx(auVar9,ZEXT416((uint)(fVar4 - *pfVar5)),0x30);
    auVar14._4_4_ = fVar6;
    auVar14._0_4_ = fVar6;
    auVar14._8_4_ = fVar6;
    auVar14._12_4_ = fVar6;
    vdivps_avx(auVar9,auVar14);
  }
  QVar21 = normalized(this);
  return (Quat4f)QVar21.m_elements;
}

Assistant:

Quat4f Quat4f::fromRotationMatrix( const Matrix3f& m )
{
	float x;
	float y;
	float z;
	float w;

	// Compute one plus the trace of the matrix
	float onePlusTrace = 1.0f + m( 0, 0 ) + m( 1, 1 ) + m( 2, 2 );

	if( onePlusTrace > 1e-5 )
	{
		// Direct computation
		float s = sqrt( onePlusTrace ) * 2.0f;
		x = ( m( 2, 1 ) - m( 1, 2 ) ) / s;
		y = ( m( 0, 2 ) - m( 2, 0 ) ) / s;
		z = ( m( 1, 0 ) - m( 0, 1 ) ) / s;
		w = 0.25f * s;
	}
	else
	{
		// Computation depends on major diagonal term
		if( ( m( 0, 0 ) > m( 1, 1 ) ) & ( m( 0, 0 ) > m( 2, 2 ) ) )
		{
			float s = sqrt( 1.0f + m( 0, 0 ) - m( 1, 1 ) - m( 2, 2 ) ) * 2.0f;
			x = 0.25f * s;
			y = ( m( 0, 1 ) + m( 1, 0 ) ) / s;
			z = ( m( 0, 2 ) + m( 2, 0 ) ) / s;
			w = ( m( 1, 2 ) - m( 2, 1 ) ) / s;
		}
		else if( m( 1, 1 ) > m( 2, 2 ) )
		{
			float s = sqrt( 1.0f + m( 1, 1 ) - m( 0, 0 ) - m( 2, 2 ) ) * 2.0f;
			x = ( m( 0, 1 ) + m( 1, 0 ) ) / s;
			y = 0.25f * s;
			z = ( m( 1, 2 ) + m( 2, 1 ) ) / s;
			w = ( m( 0, 2 ) - m( 2, 0 ) ) / s;
		}
		else
		{
			float s = sqrt( 1.0f + m( 2, 2 ) - m( 0, 0 ) - m( 1, 1 ) ) * 2.0f;
			x = ( m( 0, 2 ) + m( 2, 0 ) ) / s;
			y = ( m( 1, 2 ) + m( 2, 1 ) ) / s;
			z = 0.25f * s;
			w = ( m( 0, 1 ) - m( 1, 0 ) ) / s;
		}
	}

	Quat4f q( w, x, y, z );
	return q.normalized();
}